

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateDistributionVector.h
# Opt level: O0

StateDistributionVector * __thiscall StateDistributionVector::Clone(StateDistributionVector *this)

{
  StateDistributionVector *pSVar1;
  StateDistributionVector *in_stack_ffffffffffffffe8;
  StateDistributionVector *in_stack_fffffffffffffff0;
  
  pSVar1 = (StateDistributionVector *)operator_new(0x20);
  StateDistributionVector(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return pSVar1;
}

Assistant:

virtual StateDistributionVector* Clone() const
        { return new StateDistributionVector(*this); }